

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O0

void __thiscall
randomx::JitCompilerX86::generateProgramEpilogue
          (JitCompilerX86 *this,Program *prog,ProgramConfiguration *pcfg)

{
  uint8_t *in_RDX;
  JitCompilerX86 *in_RSI;
  JitCompilerX86 *in_RDI;
  uint8_t (*in_stack_ffffffffffffffd8) [3];
  
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffd8);
  emitByte(in_RDI,(char)*(undefined4 *)(in_RDX + 0x10) + 0xc0);
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffd8);
  emitByte(in_RDI,(char)*(undefined4 *)(in_RDX + 0x14) + 0xc0);
  emit(in_RSI,in_RDX,(size_t)in_RDI);
  memcpy(in_RDI->code + in_RDI->codePos,codeLoopStore,(long)loopStoreSize);
  in_RDI->codePos = loopStoreSize + in_RDI->codePos;
  emit<3ul>(in_RDI,in_stack_ffffffffffffffd8);
  emit<2ul>(in_RDI,(uint8_t (*) [2])in_stack_ffffffffffffffd8);
  emit32(in_RDI,(prologueSize - in_RDI->codePos) - 4);
  emitByte(in_RDI,0xe9);
  emit32(in_RDI,(epilogueOffset - in_RDI->codePos) - 4);
  return;
}

Assistant:

void JitCompilerX86::generateProgramEpilogue(Program& prog, ProgramConfiguration& pcfg) {
		emit(REX_MOV_RR64);
		emitByte(0xc0 + pcfg.readReg0);
		emit(REX_XOR_RAX_R64);
		emitByte(0xc0 + pcfg.readReg1);
		emit(ADDR(randomx_prefetch_scratchpad), ADDR(randomx_prefetch_scratchpad_end) - ADDR(randomx_prefetch_scratchpad));
		memcpy(code + codePos, codeLoopStore, loopStoreSize);
		codePos += loopStoreSize;
		emit(SUB_EBX);
		emit(JNZ);
		emit32(prologueSize - codePos - 4);
		emitByte(JMP);
		emit32(epilogueOffset - codePos - 4);
	}